

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O0

Gia_Man_t * Cec_ManFraSpecReduction(Cec_ManFra_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Gia_Man_t *p_01;
  char *pcVar7;
  undefined4 *__s;
  void *__ptr;
  Gia_Obj_t *pObj_00;
  Gia_Man_t *pGVar8;
  bool bVar9;
  int *pDepths;
  int *piCopies;
  int local_48;
  int fCompl;
  int i;
  int iMiter;
  int iNode;
  int iRepr;
  int iRes1;
  int iRes0;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Cec_ManFra_t *p_local;
  
  Gia_ManSetPhase(p->pAig);
  Vec_IntClear(p->vXorNodes);
  if (p->pPars->nLevelMax != 0) {
    Gia_ManLevelNum(p->pAig);
  }
  iVar1 = Gia_ManObjNum(p->pAig);
  p_01 = Gia_ManStart(iVar1);
  pcVar7 = Abc_UtilStrsav(p->pAig->pName);
  p_01->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(p->pAig->pName);
  p_01->pSpec = pcVar7;
  Gia_ManHashAlloc(p_01);
  iVar1 = Gia_ManObjNum(p->pAig);
  __s = (undefined4 *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p->pAig);
  memset(__s,0xff,(long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p->pAig);
  __ptr = calloc((long)iVar1,4);
  *__s = 0;
  local_48 = 1;
  do {
    bVar9 = false;
    if (local_48 < p->pAig->nObjs) {
      pRepr = Gia_ManObj(p->pAig,local_48);
      bVar9 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) {
      if (__s != (undefined4 *)0x0) {
        free(__s);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      Gia_ManHashStop(p_01);
      Gia_ManSetRegNum(p_01,0);
      pGVar8 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      return pGVar8;
    }
    iVar1 = Gia_ObjIsCi(pRepr);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pRepr);
      if (((iVar1 == 0) && (iVar1 = Gia_ObjFaninId0(pRepr,local_48), __s[iVar1] != -1)) &&
         (iVar1 = Gia_ObjFaninId1(pRepr,local_48), __s[iVar1] != -1)) {
        iVar1 = Gia_ObjFaninId0(pRepr,local_48);
        iVar1 = __s[iVar1];
        iVar2 = Gia_ObjFaninC0(pRepr);
        iVar2 = Abc_LitNotCond(iVar1,iVar2);
        iVar1 = Gia_ObjFaninId1(pRepr,local_48);
        iVar1 = __s[iVar1];
        iVar3 = Gia_ObjFaninC1(pRepr);
        iVar1 = Abc_LitNotCond(iVar1,iVar3);
        iVar2 = Gia_ManHashAnd(p_01,iVar2,iVar1);
        __s[local_48] = iVar2;
        iVar1 = Gia_ObjFaninId0(pRepr,local_48);
        iVar1 = *(int *)((long)__ptr + (long)iVar1 * 4);
        iVar3 = Gia_ObjFaninId1(pRepr,local_48);
        iVar1 = Abc_MaxInt(iVar1,*(int *)((long)__ptr + (long)iVar3 * 4));
        *(int *)((long)__ptr + (long)local_48 * 4) = iVar1;
        iVar1 = Gia_ObjRepr(p->pAig,local_48);
        if ((iVar1 != 0xfffffff) && (iVar1 = Gia_ObjFailed(p->pAig,local_48), iVar1 == 0)) {
          iVar1 = Gia_ObjRepr(p->pAig,local_48);
          if (local_48 <= iVar1) {
            __assert_fail("Gia_ObjRepr(p->pAig, i) < i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                          ,0x50,"Gia_Man_t *Cec_ManFraSpecReduction(Cec_ManFra_t *)");
          }
          iVar1 = Gia_ObjRepr(p->pAig,local_48);
          iVar1 = __s[iVar1];
          if (iVar1 != -1) {
            iVar3 = Abc_LitRegular(iVar2);
            iVar4 = Abc_LitRegular(iVar1);
            if (iVar3 != iVar4) {
              if (p->pPars->nLevelMax == 0) {
LAB_00803eb1:
                if (p->pPars->fDualOut != 0) {
                  if (p->pPars->fColorDiff == 0) {
                    pGVar8 = p->pAig;
                    iVar3 = Gia_ObjRepr(p->pAig,local_48);
                    iVar3 = Gia_ObjDiffColors2(pGVar8,iVar3,local_48);
                  }
                  else {
                    pGVar8 = p->pAig;
                    iVar3 = Gia_ObjRepr(p->pAig,local_48);
                    iVar3 = Gia_ObjDiffColors(pGVar8,iVar3,local_48);
                  }
                  if (iVar3 == 0) goto LAB_008040ba;
                }
                pGVar8 = p->pAig;
                iVar3 = Gia_ObjRepr(p->pAig,local_48);
                pObj_00 = Gia_ManObj(pGVar8,iVar3);
                uVar5 = Gia_ObjPhaseReal(pRepr);
                uVar6 = Gia_ObjPhaseReal(pObj_00);
                iVar1 = Abc_LitNotCond(iVar1,uVar5 ^ uVar6);
                __s[local_48] = iVar1;
                iVar1 = Gia_ObjProved(p->pAig,local_48);
                if (iVar1 == 0) {
                  iVar1 = Gia_ManHashXor(p_01,iVar2,__s[local_48]);
                  Gia_ManAppendCo(p_01,iVar1);
                  p_00 = p->vXorNodes;
                  iVar1 = Gia_ObjRepr(p->pAig,local_48);
                  Vec_IntPush(p_00,iVar1);
                  Vec_IntPush(p->vXorNodes,local_48);
                  iVar1 = *(int *)((long)__ptr + (long)local_48 * 4);
                  iVar2 = Gia_ObjRepr(p->pAig,local_48);
                  iVar1 = Abc_MaxInt(iVar1,*(int *)((long)__ptr + (long)iVar2 * 4));
                  *(int *)((long)__ptr + (long)local_48 * 4) = iVar1 + 1;
                  if ((p->pPars->nDepthMax != 0) &&
                     (p->pPars->nDepthMax <= *(int *)((long)__ptr + (long)local_48 * 4))) {
                    __s[local_48] = 0xffffffff;
                  }
                }
              }
              else {
                iVar3 = Gia_ObjLevelId(p->pAig,local_48);
                if (iVar3 <= p->pPars->nLevelMax) {
                  pGVar8 = p->pAig;
                  iVar3 = Abc_Lit2Var(iVar1);
                  iVar3 = Gia_ObjLevelId(pGVar8,iVar3);
                  if (iVar3 <= p->pPars->nLevelMax) goto LAB_00803eb1;
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar1 = Gia_ManAppendCi(p_01);
      __s[local_48] = iVar1;
    }
LAB_008040ba:
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs limited speculative reduction.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Cec_ManFraSpecReduction( Cec_ManFra_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr = NULL;
    int iRes0, iRes1, iRepr, iNode, iMiter;
    int i, fCompl, * piCopies, * pDepths;
    Gia_ManSetPhase( p->pAig );
    Vec_IntClear( p->vXorNodes );
    if ( p->pPars->nLevelMax )
        Gia_ManLevelNum( p->pAig );
    pNew = Gia_ManStart( Gia_ManObjNum(p->pAig) );
    pNew->pName = Abc_UtilStrsav( p->pAig->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pAig->pName );
    Gia_ManHashAlloc( pNew );
    piCopies = ABC_FALLOC( int, Gia_ManObjNum(p->pAig) );
    pDepths  = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    piCopies[0] = 0;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            piCopies[i] = Gia_ManAppendCi( pNew );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) ) 
            continue;
        if ( piCopies[Gia_ObjFaninId0(pObj,i)] == -1 ||
             piCopies[Gia_ObjFaninId1(pObj,i)] == -1 )
             continue;
        iRes0 = Abc_LitNotCond( piCopies[Gia_ObjFaninId0(pObj,i)], Gia_ObjFaninC0(pObj) );
        iRes1 = Abc_LitNotCond( piCopies[Gia_ObjFaninId1(pObj,i)], Gia_ObjFaninC1(pObj) );
        iNode = piCopies[i] = Gia_ManHashAnd( pNew, iRes0, iRes1 );
        pDepths[i] = Abc_MaxInt( pDepths[Gia_ObjFaninId0(pObj,i)], pDepths[Gia_ObjFaninId1(pObj,i)] );
        if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID || Gia_ObjFailed(p->pAig, i) )
            continue;
        assert( Gia_ObjRepr(p->pAig, i) < i );
        iRepr = piCopies[Gia_ObjRepr(p->pAig, i)];
        if ( iRepr == -1 )
            continue;
        if ( Abc_LitRegular(iNode) == Abc_LitRegular(iRepr) )
            continue;
        if ( p->pPars->nLevelMax && 
            (Gia_ObjLevelId(p->pAig, i)  > p->pPars->nLevelMax || 
             Gia_ObjLevelId(p->pAig, Abc_Lit2Var(iRepr)) > p->pPars->nLevelMax) )
            continue;
        if ( p->pPars->fDualOut )
        {
//            if ( i % 1000 == 0 && Gia_ObjRepr(p->pAig, i) )
//                Gia_ManEquivPrintOne( p->pAig, Gia_ObjRepr(p->pAig, i), 0 );
            if ( p->pPars->fColorDiff )
            {
                if ( !Gia_ObjDiffColors( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
            else
            {
                if ( !Gia_ObjDiffColors2( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
        }
        pRepr = Gia_ManObj( p->pAig, Gia_ObjRepr(p->pAig, i) );
        fCompl = Gia_ObjPhaseReal(pObj) ^ Gia_ObjPhaseReal(pRepr);
        piCopies[i] = Abc_LitNotCond( iRepr, fCompl );
        if ( Gia_ObjProved(p->pAig, i) )
            continue;
        // produce speculative miter
        iMiter = Gia_ManHashXor( pNew, iNode, piCopies[i] );
        Gia_ManAppendCo( pNew, iMiter );
        Vec_IntPush( p->vXorNodes, Gia_ObjRepr(p->pAig, i) );
        Vec_IntPush( p->vXorNodes, i );
        // add to the depth of this node
        pDepths[i] = 1 + Abc_MaxInt( pDepths[i], pDepths[Gia_ObjRepr(p->pAig, i)] );
        if ( p->pPars->nDepthMax && pDepths[i] >= p->pPars->nDepthMax )
            piCopies[i] = -1;
    }
    ABC_FREE( piCopies );
    ABC_FREE( pDepths );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}